

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsOrientFaceSides(FmsInt num_sides,FmsInt num_faces,FmsInt *face_verts,
                      FmsOrientation *orientations)

{
  FmsInt FVar1;
  FmsInt FVar2;
  bool bVar3;
  FmsInt FVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  FmsInt *pFVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  FmsInt *local_88;
  ulong auStack_78 [4];
  FmsInt aFStack_58 [2];
  FmsInt nc [4];
  FmsInt vi [4];
  
  uVar8 = (uint)num_sides;
  uVar11 = 0;
  uVar12 = 0;
  if (0 < (int)uVar8) {
    uVar12 = num_sides & 0xffffffff;
  }
  local_88 = face_verts + 1;
  for (; uVar11 != num_faces; uVar11 = uVar11 + 1) {
    iVar9 = uVar8 - 1;
    for (lVar6 = 0; uVar12 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
      lVar13 = (long)((iVar9 % (int)uVar8) * 2);
      FVar4 = face_verts[lVar13];
      FVar1 = *(FmsInt *)((long)face_verts + lVar6 * 2);
      if ((FVar4 == FVar1) || (FVar4 == *(FmsInt *)((long)face_verts + lVar6 * 2 + 8))) {
        *(FmsInt *)((long)aFStack_58 + lVar6) = FVar4;
        bVar3 = false;
        uVar5 = 1;
      }
      else {
        uVar5 = 0;
        bVar3 = true;
      }
      FVar2 = face_verts[lVar13 + 1];
      if ((FVar4 == FVar2) ||
         ((FVar2 != FVar1 && (FVar2 != *(FmsInt *)((long)face_verts + lVar6 * 2 + 8))))) {
        *(ulong *)((long)auStack_78 + lVar6) = (ulong)uVar5;
        if (bVar3) goto LAB_00105fbf;
      }
      else {
        *(FmsInt *)((long)aFStack_58 + lVar6) = FVar2;
        *(ulong *)((long)auStack_78 + lVar6) = (ulong)(uVar5 + 1);
      }
      iVar9 = iVar9 + 1;
    }
    pFVar10 = local_88;
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      if ((pFVar10[-1] != *pFVar10) &&
         ((FVar4 = pFVar10[-1], uVar14 = uVar7, auStack_78[uVar7] == 1 ||
          (uVar14 = (long)((int)uVar7 + 1) % (long)(int)uVar8 & 0xffffffff, FVar4 = *pFVar10,
          auStack_78[uVar14] == 1)))) {
        orientations[uVar7] = aFStack_58[uVar14] != FVar4;
      }
      pFVar10 = pFVar10 + 2;
    }
    orientations = orientations + (num_sides & 0xffffffff);
    face_verts = face_verts + (ulong)(uVar8 & 0x7fffffff) * 2;
    local_88 = local_88 + (ulong)(uVar8 & 0x7fffffff) * 2;
  }
LAB_00105fbf:
  return (int)(uVar11 < num_faces);
}

Assistant:

static int FmsOrientFaceSides(FmsInt num_sides, FmsInt num_faces,
                              FmsInt *face_verts,
                              FmsOrientation *orientations) {
  // The size of 'face_verts' must be 2 x 'num_sides' x 'num_faces'.
  // The size of 'orientations' must be 'num_sides' x 'num_faces'.

  // Find edge orientations that if applied to 'face_verts' lead to an array of
  // the form: (a,b,b,c,c,a), for triangles, or (a,b,b,c,c,d,d,a), for quads.
  // If one of the edge orientations cannot be uniquely determined, that edge in
  // the 'orientations' array will remain unmodified, e.g. as initialized by the
  // user.

  const int n = num_sides;
  for (FmsInt k = 0; k < num_faces; k++) {
    FmsInt nc[4], vi[4]; // at most 4 vertices/sides
    for (int i = 0; i < n; i++) {
      nc[i] = FmsIntersectTwoEdges(face_verts+2*((i+n-1)%n),
                                   face_verts+2*i, vi+i);
      if (nc[i] == 0) { E_RETURN(1); }
    }
    for (int ei = 0; ei < n; ei++) {
      int ej = (ei+1)%n;
      if (face_verts[2*ei+0] == face_verts[2*ei+1] ||
          (nc[ei] != 1 && nc[ej] != 1)) {
        // Keep the value of 'orientations[ei]' as is, e.g. as defined by the
        // user.
      } else {
        if (nc[ei] == 1) {
          orientations[ei] = (vi[ei] == face_verts[2*ei+0]) ? 0 : 1;
        } else {
          orientations[ei] = (vi[ej] == face_verts[2*ei+1]) ? 0 : 1;
        }
      }
    }
    face_verts += 2*n;
    orientations += n;
  }
  return 0;
}